

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aec_rdft.cc
# Opt level: O2

void cftfsub_128_C(float *a)

{
  ulong uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  
  (*cft1st_128)(a);
  (*cftmdl_128)(a);
  for (uVar1 = 0; uVar1 < 0x20; uVar1 = uVar1 + 2) {
    fVar2 = (float)*(undefined8 *)(a + uVar1);
    fVar3 = (float)((ulong)*(undefined8 *)(a + uVar1) >> 0x20);
    fVar4 = (float)*(undefined8 *)(a + uVar1 + 0x20);
    fVar10 = fVar2 + fVar4;
    fVar5 = (float)((ulong)*(undefined8 *)(a + uVar1 + 0x20) >> 0x20);
    fVar11 = fVar3 + fVar5;
    fVar6 = (float)*(undefined8 *)(a + uVar1 + 0x40);
    fVar7 = (float)((ulong)*(undefined8 *)(a + uVar1 + 0x40) >> 0x20);
    fVar8 = (float)*(undefined8 *)(a + uVar1 + 0x60);
    fVar12 = fVar6 + fVar8;
    fVar9 = (float)((ulong)*(undefined8 *)(a + uVar1 + 0x60) >> 0x20);
    fVar13 = fVar7 + fVar9;
    *(ulong *)(a + uVar1) = CONCAT44(fVar11 + fVar13,fVar10 + fVar12);
    *(ulong *)(a + uVar1 + 0x40) = CONCAT44(fVar11 - fVar13,fVar10 - fVar12);
    fVar2 = fVar2 - fVar4;
    fVar3 = fVar3 - fVar5;
    fVar6 = fVar6 - fVar8;
    fVar7 = fVar7 - fVar9;
    *(ulong *)(a + uVar1 + 0x20) = CONCAT44(fVar6 + fVar3,fVar2 - fVar7);
    *(ulong *)(a + uVar1 + 0x60) = CONCAT44(fVar3 - fVar6,fVar7 + fVar2);
  }
  return;
}

Assistant:

static void cftfsub_128_C(float* a) {
  int j, j1, j2, j3, l;
  float x0r, x0i, x1r, x1i, x2r, x2i, x3r, x3i;

  cft1st_128(a);
  cftmdl_128(a);
  l = 32;
  for (j = 0; j < l; j += 2) {
    j1 = j + l;
    j2 = j1 + l;
    j3 = j2 + l;
    x0r = a[j] + a[j1];
    x0i = a[j + 1] + a[j1 + 1];
    x1r = a[j] - a[j1];
    x1i = a[j + 1] - a[j1 + 1];
    x2r = a[j2] + a[j3];
    x2i = a[j2 + 1] + a[j3 + 1];
    x3r = a[j2] - a[j3];
    x3i = a[j2 + 1] - a[j3 + 1];
    a[j] = x0r + x2r;
    a[j + 1] = x0i + x2i;
    a[j2] = x0r - x2r;
    a[j2 + 1] = x0i - x2i;
    a[j1] = x1r - x3i;
    a[j1 + 1] = x1i + x3r;
    a[j3] = x1r + x3i;
    a[j3 + 1] = x1i - x3r;
  }
}